

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

void __thiscall
aeron::archive::AeronArchive::stopRecording(AeronArchive *this,string *channel,int32_t streamId)

{
  anon_class_24_3_342da72b local_58;
  function<bool_(long)> local_40;
  int32_t local_1c;
  string *psStack_18;
  int32_t streamId_local;
  string *channel_local;
  AeronArchive *this_local;
  
  local_58.streamId = &local_1c;
  local_58.this = this;
  local_58.channel = channel;
  local_1c = streamId;
  psStack_18 = channel;
  channel_local = (string *)this;
  std::function<bool(long)>::
  function<aeron::archive::AeronArchive::stopRecording(std::__cxx11::string_const&,int)::__0,void>
            ((function<bool(long)> *)&local_40,&local_58);
  callAndPollForResponse(this,&local_40,"stop recording");
  std::function<bool_(long)>::~function(&local_40);
  return;
}

Assistant:

void AeronArchive::stopRecording(const std::string& channel, std::int32_t streamId) {
    callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->stopRecording(channel, streamId, correlationId, controlSessionId_);
        },
        "stop recording");
}